

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256.h
# Opt level: O0

optional<uint160> * detail::FromHex<uint160>(string_view str)

{
  long lVar1;
  string_view str_00;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  optional<uint160> *in_RDI;
  long in_FS_OFFSET;
  string_view in_stack_00000030;
  uint160 rv;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  optional<uint160> *this;
  size_t in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  base_blob<160U> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  uVar3 = base_blob<160U>::size();
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff88);
  if (uVar3 << 1 == sVar4) {
    str_00._M_str = in_stack_ffffffffffffffb8;
    str_00._M_len = in_stack_ffffffffffffffb0;
    bVar2 = IsHex(str_00);
    if (bVar2) {
      uint160::uint160((uint160 *)in_stack_ffffffffffffff88);
      base_blob<160U>::SetHexDeprecated(in_stack_ffffffffffffffe0,in_stack_00000030);
      std::optional<uint160>::optional<uint160,_true>(this,(uint160 *)in_RDI);
      goto LAB_00bfdf63;
    }
  }
  std::optional<uint160>::optional(in_RDI);
LAB_00bfdf63:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uintN_t> FromHex(std::string_view str)
{
    if (uintN_t::size() * 2 != str.size() || !IsHex(str)) return std::nullopt;
    uintN_t rv;
    rv.SetHexDeprecated(str);
    return rv;
}